

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O0

void set_sl_rr(OPL3 *chip,int slot,int v)

{
  int iVar1;
  uint uVar2;
  UINT32 local_34;
  OPL3_SLOT *SLOT;
  OPL3_CH *CH;
  int v_local;
  int slot_local;
  OPL3 *chip_local;
  
  iVar1 = slot / 2;
  uVar2 = slot & 1;
  chip->P_CH[iVar1].SLOT[(int)uVar2].sl = sl_tab[v >> 4];
  if ((v & 0xfU) == 0) {
    local_34 = 0;
  }
  else {
    local_34 = (v & 0xfU) * 4 + 0x10;
  }
  chip->P_CH[iVar1].SLOT[(int)uVar2].rr = local_34;
  chip->P_CH[iVar1].SLOT[(int)uVar2].eg_sh_rr =
       ""[chip->P_CH[iVar1].SLOT[(int)uVar2].rr + (uint)chip->P_CH[iVar1].SLOT[(int)uVar2].ksr];
  chip->P_CH[iVar1].SLOT[(int)uVar2].eg_m_rr =
       (1 << (chip->P_CH[iVar1].SLOT[(int)uVar2].eg_sh_rr & 0x1f)) - 1;
  chip->P_CH[iVar1].SLOT[(int)uVar2].eg_sel_rr =
       "pppppppppppppppp"
       [chip->P_CH[iVar1].SLOT[(int)uVar2].rr + (uint)chip->P_CH[iVar1].SLOT[(int)uVar2].ksr];
  return;
}

Assistant:

INLINE void set_sl_rr(UINT8 type, FM_SLOT *SLOT,int v)
{
	SLOT->sl = sl_table[ v>>4 ];

	/* check EG state changes */
	if ((SLOT->state == EG_DEC) && (SLOT->volume >= (INT32)(SLOT->sl)))
		SLOT->state = EG_SUS;

	SLOT->rr  = 34 + ((v&0x0f)<<2);

	SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr  + SLOT->ksr];
	SLOT->eg_sel_rr = eg_rate_select[SLOT->rr  + SLOT->ksr];
}